

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NamerTests.cpp
# Opt level: O0

void __thiscall TestNameResetter::~TestNameResetter(TestNameResetter *this)

{
  string *in_RDI;
  
  std::__cxx11::string::operator=
            ((string *)ApprovalTests::TestName::directoryPrefix_abi_cxx11_,in_RDI);
  std::__cxx11::string::~string(in_RDI);
  return;
}

Assistant:

~TestNameResetter()
    {
        TestName::directoryPrefix = oldPrefix_;
    }